

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

void __thiscall QCss::Declaration::styleValues(Declaration *this,BorderStyle *s)

{
  DeclarationData *pDVar1;
  BorderStyle BVar2;
  P _a;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    pDVar1 = (this->d).d.ptr;
    uVar3 = (pDVar1->values).d.size;
    if (3 < uVar3) {
      uVar3 = 4;
    }
    if (uVar3 <= uVar5) break;
    BVar2 = parseStyleValue((Value *)((long)&((pDVar1->values).d.ptr)->type + lVar4));
    s[uVar5] = BVar2;
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x28;
  }
  switch(uVar5 & 0xffffffff) {
  case 0:
    s[0] = BorderStyle_None;
    s[1] = BorderStyle_None;
    s[2] = BorderStyle_None;
    s[3] = BorderStyle_None;
    break;
  case 1:
    BVar2 = *s;
    s[1] = BVar2;
    s[2] = BVar2;
    goto LAB_0053fdfc;
  case 2:
    *(undefined8 *)(s + 2) = *(undefined8 *)s;
    break;
  case 3:
    BVar2 = s[1];
LAB_0053fdfc:
    s[3] = BVar2;
  }
  return;
}

Assistant:

void Declaration::styleValues(BorderStyle *s) const
{
    int i;
    for (i = 0; i < qMin(d->values.size(), 4); i++)
        s[i] = parseStyleValue(d->values.at(i));
    if (i == 0) s[0] = s[1] = s[2] = s[3] = BorderStyle_None;
    else if (i == 1) s[3] = s[2] = s[1] = s[0];
    else if (i == 2) s[2] = s[0], s[3] = s[1];
    else if (i == 3) s[3] = s[1];
}